

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void gen_gvec_op3_env(DisasContext_conflict1 *s,_Bool is_q,int rd,int rn,int rm,undefined1 *fn)

{
  undefined7 in_register_00000031;
  undefined1 *in_stack_00000008;
  
  tcg_gen_gvec_3_ptr_aarch64
            ((TCGContext_conflict1 *)CONCAT71(in_register_00000031,is_q),rn * 0x100 + 0xc10,
             rm * 0x100 + 0xc10,(int)fn * 0x100 + 0xc10,
             ((TCGContext_conflict1 *)CONCAT71(in_register_00000031,is_q))->cpu_env,rd * 8 + 8,
             (uint32_t)s,0,in_stack_00000008);
  return;
}

Assistant:

static void gen_gvec_op3_env(DisasContext *s, bool is_q, int rd,
                             int rn, int rm, gen_helper_gvec_3_ptr *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, rd),
                       vec_full_reg_offset(s, rn),
                       vec_full_reg_offset(s, rm), tcg_ctx->cpu_env,
                       is_q ? 16 : 8, vec_full_reg_size(s), 0, fn);
}